

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

CropResizeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_cropresize(NeuralNetworkLayer *this)

{
  bool bVar1;
  CropResizeLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_cropresize(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_cropresize(this);
    this_00 = (CropResizeLayerParams *)operator_new(0x48);
    CropResizeLayerParams::CropResizeLayerParams(this_00);
    (this->layer_).cropresize_ = this_00;
  }
  return (CropResizeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::CropResizeLayerParams* NeuralNetworkLayer::mutable_cropresize() {
  if (!has_cropresize()) {
    clear_layer();
    set_has_cropresize();
    layer_.cropresize_ = new ::CoreML::Specification::CropResizeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.cropResize)
  return layer_.cropresize_;
}